

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_free_internal_r(lyd_node *node,int top)

{
  lyd_node *plVar1;
  int permanent;
  lyd_node *local_28;
  lyd_node *iter;
  lyd_node *next;
  int top_local;
  lyd_node *node_local;
  
  if (node != (lyd_node *)0x0) {
    permanent = 2;
    if (top != 0) {
      permanent = 1;
    }
    lyd_unlink_internal(node,permanent);
    if ((node->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      local_28 = node->child;
      while (local_28 != (lyd_node *)0x0) {
        plVar1 = local_28->next;
        lyd_free_internal_r(local_28,0);
        local_28 = plVar1;
      }
    }
    _lyd_free_node(node);
  }
  return;
}

Assistant:

static void
lyd_free_internal_r(struct lyd_node *node, int top)
{
    struct lyd_node *next, *iter;

    if (!node) {
        return;
    }

    /* if freeing top-level, always remove it from the parent hash table */
    lyd_unlink_internal(node, (top ? 1 : 2));

    if (!(node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {
        /* free children */
        LY_TREE_FOR_SAFE(node->child, next, iter) {
            lyd_free_internal_r(iter, 0);
        }
    }

    _lyd_free_node(node);
}